

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void __thiscall
CLI::IsMember::IsMember<std::vector<char_const*,std::allocator<char_const*>>>
          (IsMember *this,vector<const_char_*,_std::allocator<const_char_*>_> *set,
          filter_fn_t *filter_fn_1,filter_fn_t *filter_fn_2)

{
  anon_class_64_2_53a4bb40 local_80;
  vector<const_char_*,_std::allocator<const_char_*>_> local_40;
  filter_fn_t *local_28;
  filter_fn_t *filter_fn_2_local;
  filter_fn_t *filter_fn_1_local;
  vector<const_char_*,_std::allocator<const_char_*>_> *set_local;
  IsMember *this_local;
  
  local_28 = filter_fn_2;
  filter_fn_2_local = filter_fn_1;
  filter_fn_1_local = (filter_fn_t *)set;
  set_local = (vector<const_char_*,_std::allocator<const_char_*>_> *)this;
  _GLOBAL__N_1::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_40,set);
  _GLOBAL__N_1::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_80.filter_fn_1,filter_fn_1);
  _GLOBAL__N_1::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_80.filter_fn_2,filter_fn_2);
  IsMember<std::vector<char_const*,std::allocator<char_const*>>,CLI::IsMember::vector<std::vector<char_const*,std::allocator<char_const*>>>(std::vector<char_const*,std::allocator<char_const*>>&&,std::function<std::__cxx11::string(std::__cxx11::string)>,std::function<std::__cxx11::string(std::__cxx11::string)>)::_lambda(std::__cxx11::string)_1_>
            (this,&local_40,&local_80);
  IsMember<std::vector<char_const*,std::allocator<char_const*>>>(std::vector<char_const*,std::allocator<char_const*>>&&,std::function<std::__cxx11::string(std::__cxx11::string)>,std::function<std::__cxx11::string(std::__cxx11::string)>)
  ::{lambda(std::__cxx11::string)#1}::~function((_lambda_std____cxx11__string__1_ *)&local_80);
  _GLOBAL__N_1::std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&local_40);
  return;
}

Assistant:

IsMember(T &&set, filter_fn_t filter_fn_1, filter_fn_t filter_fn_2, Args &&...other)
        : IsMember(
              std::forward<T>(set),
              [filter_fn_1, filter_fn_2](std::string a) { return filter_fn_2(filter_fn_1(a)); },
              other...) {}